

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_e36d82::RateRepresentationPredicate::Rate
          (RateRepresentationPredicate *this,IfcRepresentation *r)

{
  RateRepresentationPredicate *pRVar1;
  int iVar2;
  IfcRepresentationItem *pIVar3;
  long lVar4;
  IfcRepresentationMap *pIVar5;
  Object *pOVar6;
  
  if (this[0x38] == (RateRepresentationPredicate)0x1) {
    do {
      pRVar1 = this + 0x18;
      iVar2 = std::__cxx11::string::compare((char *)pRVar1);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)pRVar1);
        if (iVar2 == 0) {
          return -3;
        }
        iVar2 = std::__cxx11::string::compare((char *)pRVar1);
        if (iVar2 == 0) {
          return -10;
        }
        iVar2 = std::__cxx11::string::compare((char *)pRVar1);
        if (iVar2 == 0) {
          return -5;
        }
        iVar2 = std::__cxx11::string::compare((char *)pRVar1);
        if (iVar2 == 0) {
          return -2;
        }
        iVar2 = std::__cxx11::string::compare((char *)pRVar1);
        if (iVar2 == 0) {
          return 100;
        }
        iVar2 = std::__cxx11::string::compare((char *)pRVar1);
        if (iVar2 != 0) {
          return 0;
        }
        return 100;
      }
      if (*(undefined8 **)(this + 0x68) == *(undefined8 **)(this + 0x70)) {
        return 100;
      }
      pIVar3 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentationItem>
                         ((LazyObject *)**(undefined8 **)(this + 0x68));
      lVar4 = __dynamic_cast((_func_int *)
                             ((long)&(pIVar3->
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     )._vptr_ObjectHelper +
                             (long)(pIVar3->
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   )._vptr_ObjectHelper[-3]),&Assimp::STEP::Object::typeinfo,
                             &Assimp::IFC::Schema_2x3::IfcMappedItem::typeinfo,0xffffffffffffffff);
      if (lVar4 == 0) {
        return 100;
      }
      pIVar5 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                         (*(LazyObject **)(lVar4 + 0x20));
      pOVar6 = Assimp::STEP::LazyObject::operator*
                         (*(LazyObject **)
                           &(pIVar5->
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>).
                            field_0x20);
      this = (RateRepresentationPredicate *)
             __dynamic_cast(pOVar6,&Assimp::STEP::Object::typeinfo,
                            &Assimp::IFC::Schema_2x3::IfcRepresentation::typeinfo);
    } while (this[0x38] != (RateRepresentationPredicate)0x0);
  }
  return 0;
}

Assistant:

int Rate(const Schema_2x3::IfcRepresentation* r) const {
        // the smaller, the better

        if (! r->RepresentationIdentifier) {
            // neutral choice if no extra information is specified
            return 0;
        }


        const std::string& name = r->RepresentationIdentifier.Get();
        if (name == "MappedRepresentation") {
            if (!r->Items.empty()) {
                // take the first item and base our choice on it
                const Schema_2x3::IfcMappedItem* const m = r->Items.front()->ToPtr<Schema_2x3::IfcMappedItem>();
                if (m) {
                    return Rate(m->MappingSource->MappedRepresentation);
                }
            }
            return 100;
        }

        return Rate(name);
    }